

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O0

void FT_Vector_Transform(FT_Vector *vector,FT_Matrix *matrix)

{
  FT_Long FVar1;
  FT_Long FVar2;
  FT_Long FVar3;
  FT_Long FVar4;
  FT_Pos yz;
  FT_Pos xz;
  FT_Matrix *matrix_local;
  FT_Vector *vector_local;
  
  if ((vector != (FT_Vector *)0x0) && (matrix != (FT_Matrix *)0x0)) {
    FVar1 = FT_MulFix(vector->x,matrix->xx);
    FVar2 = FT_MulFix(vector->y,matrix->xy);
    FVar3 = FT_MulFix(vector->x,matrix->yx);
    FVar4 = FT_MulFix(vector->y,matrix->yy);
    vector->x = FVar1 + FVar2;
    vector->y = FVar3 + FVar4;
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Vector_Transform( FT_Vector*        vector,
                       const FT_Matrix*  matrix )
  {
    FT_Pos  xz, yz;


    if ( !vector || !matrix )
      return;

    xz = FT_MulFix( vector->x, matrix->xx ) +
         FT_MulFix( vector->y, matrix->xy );

    yz = FT_MulFix( vector->x, matrix->yx ) +
         FT_MulFix( vector->y, matrix->yy );

    vector->x = xz;
    vector->y = yz;
  }